

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  FieldDescriptor *pFVar1;
  Descriptor *pDVar2;
  int iVar3;
  FieldDescriptorProto *proto_00;
  DescriptorProto *proto_01;
  int local_28;
  int local_24;
  int i_1;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar3 = FileDescriptor::extension_count(file);
    if (iVar3 <= local_24) break;
    pFVar1 = file->extensions_;
    proto_00 = FileDescriptorProto::extension(proto,local_24);
    ValidateProto3Field(this,pFVar1 + local_24,proto_00);
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar3 = FileDescriptor::message_type_count(file);
    if (iVar3 <= local_28) break;
    pDVar2 = file->message_types_;
    proto_01 = FileDescriptorProto::message_type(proto,local_28);
    ValidateProto3Message(this,pDVar2 + local_28,proto_01);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3(const FileDescriptor* file,
                                       const FileDescriptorProto& proto) {
  for (int i = 0; i < file->extension_count(); ++i) {
    ValidateProto3Field(file->extensions_ + i, proto.extension(i));
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    ValidateProto3Message(file->message_types_ + i, proto.message_type(i));
  }
}